

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relivedb.cpp
# Opt level: O0

void __thiscall relive::ReLiveDB::setConfigValueString(ReLiveDB *this,string *key,string *value)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  string *in_RDX;
  string *in_RSI;
  double __x;
  lock_guard<std::recursive_mutex> lock;
  KeyValue kv;
  ostringstream os;
  mutex_type *in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffca0;
  memory_order in_stack_fffffffffffffca4;
  atomic<bool> *in_stack_fffffffffffffca8;
  KeyValue *in_stack_fffffffffffffcd8;
  storage_t<_86c824a_> *in_stack_fffffffffffffce0;
  string local_2e0 [32];
  string local_2c0 [32];
  undefined1 local_2a0 [40];
  string local_278 [39];
  allocator<char> local_251;
  string local_250 [39];
  allocator<char> local_229;
  string local_228;
  string local_208;
  ostringstream local_1e8 [399];
  allocator<char> local_59;
  string local_58;
  string local_38;
  string *local_18;
  string *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (setConfigValueString::_isActive) {
    bVar1 = std::atomic<bool>::load(in_stack_fffffffffffffca8,in_stack_fffffffffffffca4);
    if (!bVar1) {
      pcVar2 = std::type_info::name((type_info *)&typeinfo);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,pcVar2,&local_59);
      stripTypeName(&local_38,&local_58);
      LogManager::registerIsActive
                (&local_38,2,&setConfigValueString::_init,&setConfigValueString::_isActive);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(&local_59);
      if ((setConfigValueString::_isActive & 1U) == 0) goto LAB_0016792b;
    }
    std::__cxx11::ostringstream::ostringstream(local_1e8);
    poVar3 = std::operator<<((ostream *)local_1e8,"Setting config value: ");
    poVar3 = std::operator<<(poVar3,local_10);
    in_stack_fffffffffffffce0 = (storage_t<_86c824a_> *)std::operator<<(poVar3," = \'");
    in_stack_fffffffffffffcd8 =
         (KeyValue *)std::operator<<((ostream *)in_stack_fffffffffffffce0,local_18);
    std::operator<<((ostream *)in_stack_fffffffffffffcd8,"\'");
    pcVar2 = std::type_info::name((type_info *)&typeinfo);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,pcVar2,&local_229);
    stripTypeName(&local_208,&local_228);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_250,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/src/backend/relivedb.cpp"
               ,&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_278,
               "void relive::ReLiveDB::setConfigValueString(const std::string &, const std::string &)"
               ,(allocator<char> *)(local_2a0 + 0x27));
    __x = (double)std::__cxx11::ostringstream::str();
    in_stack_fffffffffffffc98 = (mutex_type *)local_2a0;
    LogManager::log(__x);
    std::__cxx11::string::~string((string *)local_2a0);
    std::__cxx11::string::~string(local_278);
    std::allocator<char>::~allocator((allocator<char> *)(local_2a0 + 0x27));
    std::__cxx11::string::~string(local_250);
    std::allocator<char>::~allocator(&local_251);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator(&local_229);
    std::__cxx11::ostringstream::~ostringstream(local_1e8);
  }
LAB_0016792b:
  std::__cxx11::string::string(local_2e0,local_10);
  std::__cxx11::string::string(local_2c0,local_18);
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),in_stack_fffffffffffffc98
            );
  storage_abi_cxx11_();
  sqlite_orm::internal::storage_t<$86c824a$>::replace<relive::KeyValue>
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1679a4);
  KeyValue::~KeyValue((KeyValue *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
  return;
}

Assistant:

void ReLiveDB::setConfigValueString(const std::string& key, const std::string& value)
{
    using namespace sqlite_orm;
    DEBUG_LOG(2, "Setting config value: " << key << " = '" << value << "'");
    KeyValue kv{key, value};
    std::lock_guard<Mutex> lock{_mutex};
    storage().replace(kv);
}